

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

VkPrimitiveTopology vkt::pipeline::anon_unknown_0::getPrimitiveTopology(GeometryType geometryType)

{
  VkPrimitiveTopology local_c;
  GeometryType geometryType_local;
  
  switch(geometryType) {
  case GEOMETRY_TYPE_OPAQUE_TRIANGLE:
  case GEOMETRY_TYPE_INVISIBLE_TRIANGLE:
    local_c = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    break;
  case GEOMETRY_TYPE_OPAQUE_LINE:
    local_c = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
    break;
  case GEOMETRY_TYPE_OPAQUE_POINT:
    local_c = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
    break;
  case GEOMETRY_TYPE_OPAQUE_QUAD:
  case GEOMETRY_TYPE_OPAQUE_QUAD_NONZERO_DEPTH:
  case GEOMETRY_TYPE_TRANSLUCENT_QUAD:
  case GEOMETRY_TYPE_INVISIBLE_QUAD:
  case GEOMETRY_TYPE_GRADIENT_QUAD:
    local_c = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    break;
  default:
    local_c = VK_PRIMITIVE_TOPOLOGY_LAST;
  }
  return local_c;
}

Assistant:

VkPrimitiveTopology getPrimitiveTopology (const GeometryType geometryType)
{
	switch (geometryType)
	{
		case GEOMETRY_TYPE_OPAQUE_TRIANGLE:
		case GEOMETRY_TYPE_INVISIBLE_TRIANGLE:			return VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;

		case GEOMETRY_TYPE_OPAQUE_LINE:					return VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
		case GEOMETRY_TYPE_OPAQUE_POINT:				return VK_PRIMITIVE_TOPOLOGY_POINT_LIST;

		case GEOMETRY_TYPE_OPAQUE_QUAD:
		case GEOMETRY_TYPE_OPAQUE_QUAD_NONZERO_DEPTH:
		case GEOMETRY_TYPE_TRANSLUCENT_QUAD:
		case GEOMETRY_TYPE_INVISIBLE_QUAD:
		case GEOMETRY_TYPE_GRADIENT_QUAD:				return VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;

		default:
			DE_ASSERT(false);
			return VK_PRIMITIVE_TOPOLOGY_LAST;
	}
}